

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::MultisampleTextureUsageCase::iterate
          (MultisampleTextureUsageCase *this)

{
  ostringstream *poVar1;
  uint uVar2;
  int iVar3;
  TestLog *pTVar4;
  RenderContext *context;
  int iVar5;
  bool bVar6;
  deUint32 dVar7;
  int iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RenderTarget *pRVar14;
  size_t __n;
  Surface *surface;
  int iVar15;
  void *__buf;
  void *__buf_00;
  char *description;
  float fVar16;
  float fVar17;
  float local_2cc;
  allocator<char> local_2b8;
  allocator<char> local_2b7;
  allocator<char> local_2b6;
  allocator<char> local_2b5;
  undefined4 local_2b4;
  ScopedLogSection section;
  Surface result;
  Buffer vertexAttibBuffer;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  Random rnd;
  float clearColor [4];
  long lVar13;
  
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)clearColor,"Sample",(allocator<char> *)&local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexAttibBuffer,"Render to texture and sample texture",
             (allocator<char> *)&local_248);
  tcu::ScopedLogSection::ScopedLogSection
            (&section,pTVar4,(string *)clearColor,(string *)&vertexAttibBuffer);
  std::__cxx11::string::~string((string *)&vertexAttibBuffer);
  std::__cxx11::string::~string((string *)clearColor);
  tcu::Surface::Surface(&result,0x100,0x100);
  local_2cc = 1.0;
  fVar17 = 0.0;
  if ((this->m_isColorFormat == false) && (this->m_isDepthFormat == false)) {
    if ((this->m_isUnsignedFormat & 1U) == 0) {
      fVar17 = 1.0;
    }
    if (this->m_isSignedFormat == false) {
      if (this->m_isUnsignedFormat == false) {
        local_2cc = -1.0;
      }
      else {
        local_2cc = 200.0;
      }
    }
    else {
      fVar17 = -100.0;
      local_2cc = 100.0;
    }
  }
  dVar7 = deUint32Hash(this->m_type);
  deRandom_init(&rnd.m_rnd,dVar7);
  fVar16 = deRandom_getFloat(&rnd.m_rnd);
  local_2cc = (local_2cc - fVar17) * fVar16 + fVar17;
  if ((this->m_isSignedFormat != false) || (this->m_isUnsignedFormat == true)) {
    local_2cc = floorf(local_2cc);
  }
  if (((anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)::fullscreenQuad ==
       '\0') &&
     (iVar8 = __cxa_guard_acquire(&(anonymous_namespace)::MultisampleTextureUsageCase::
                                   renderToTexture(float)::fullscreenQuad), iVar8 != 0)) {
    (anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)::fullscreenQuad._0_8_
         = 0xbf800000bf800000;
    (anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)::fullscreenQuad._8_8_
         = 0x3f80000000000000;
    (anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)::fullscreenQuad.
    _16_8_ = 0x3f800000bf800000;
    (anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)::fullscreenQuad.
    _24_8_ = 0x3f80000000000000;
    (anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)::fullscreenQuad.
    _32_8_ = 0xbf8000003f800000;
    (anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)::fullscreenQuad.
    _40_8_ = 0x3f80000000000000;
    (anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)::fullscreenQuad.
    _48_4_ = 0x3f800000;
    (anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)::fullscreenQuad.
    _52_4_ = 0x3f800000;
    (anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)::fullscreenQuad.
    _56_4_ = 0;
    (anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)::fullscreenQuad.
    _60_4_ = 0x3f800000;
    __cxa_guard_release(&(anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)
                         ::fullscreenQuad);
  }
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar8);
  uVar9 = (**(code **)(lVar13 + 0x780))((this->m_drawShader->m_program).m_program,"a_position");
  uVar10 = (**(code **)(lVar13 + 0xb48))((this->m_drawShader->m_program).m_program,"u_writeValue");
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&vertexAttibBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  clearColor._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(clearColor + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Filling multisample texture with value ");
  std::ostream::operator<<(poVar1,local_2cc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)clearColor,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(lVar13 + 0x40))(0x8892,vertexAttibBuffer.super_ObjectWrapper.m_object);
  (**(code **)(lVar13 + 0x150))
            (0x8892,0x40,
             (anonymous_namespace)::MultisampleTextureUsageCase::renderToTexture(float)::
             fullscreenQuad,0x88e4);
  dVar7 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar7,"bufferdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x577);
  (**(code **)(lVar13 + 0x78))(0x8d40,this->m_fboID);
  (**(code **)(lVar13 + 0x1a00))(0,0,0x100,0x100);
  if (this->m_isColorFormat == true) {
    clearColor[0] = 0.0;
    clearColor[1] = 0.0;
    clearColor[2] = 0.0;
    clearColor[3] = 0.0;
    (**(code **)(lVar13 + 0x1a8))(0x1800,0);
  }
  else if (this->m_isSignedFormat == true) {
    clearColor[0] = 0.0;
    clearColor[1] = 0.0;
    clearColor[2] = 0.0;
    clearColor[3] = 0.0;
    (**(code **)(lVar13 + 0x1b0))(0x1800,0);
  }
  else if (this->m_isUnsignedFormat == true) {
    clearColor[0] = 0.0;
    clearColor[1] = 0.0;
    clearColor[2] = 0.0;
    clearColor[3] = 0.0;
    (**(code **)(lVar13 + 0x1b8))(0x1800,0);
  }
  else if (this->m_isDepthFormat == true) {
    clearColor[0] = 0.5;
    (**(code **)(lVar13 + 0x1a8))(0x1801,0);
  }
  dVar7 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar7,"clear buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x593);
  (**(code **)(lVar13 + 0x19f0))(uVar9,4,0x1406,0,0,0);
  (**(code **)(lVar13 + 0x610))(uVar9);
  (**(code **)(lVar13 + 0x1680))((this->m_drawShader->m_program).m_program);
  (**(code **)(lVar13 + 0x14e0))(local_2cc,uVar10);
  dVar7 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar7,"setup draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x59d);
  if (this->m_isDepthFormat == true) {
    (**(code **)(lVar13 + 0x5e0))(0xb71);
    (**(code **)(lVar13 + 0x4a0))(0x207);
  }
  (**(code **)(lVar13 + 0x538))(5,0,4);
  dVar7 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar7,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5a6);
  if (this->m_isDepthFormat == true) {
    (**(code **)(lVar13 + 0x4e8))(0xb71);
  }
  (**(code **)(lVar13 + 0x518))(uVar9);
  (**(code **)(lVar13 + 0x1680))(0);
  (**(code **)(lVar13 + 0x78))(0x8d40,0);
  dVar7 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar7,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5b0);
  glu::ObjectWrapper::~ObjectWrapper(&vertexAttibBuffer.super_ObjectWrapper);
  if (((anonymous_namespace)::MultisampleTextureUsageCase::sampleTexture(tcu::Surface&,float)::
       fullscreenQuad == '\0') &&
     (iVar8 = __cxa_guard_acquire(&(anonymous_namespace)::MultisampleTextureUsageCase::
                                   sampleTexture(tcu::Surface&,float)::fullscreenQuad), iVar8 != 0))
  {
    (anonymous_namespace)::MultisampleTextureUsageCase::sampleTexture(tcu::Surface&,float)::
    fullscreenQuad._0_8_ = 0xbf800000bf800000;
    (anonymous_namespace)::MultisampleTextureUsageCase::sampleTexture(tcu::Surface&,float)::
    fullscreenQuad._8_8_ = 0x3f80000000000000;
    (anonymous_namespace)::MultisampleTextureUsageCase::sampleTexture(tcu::Surface&,float)::
    fullscreenQuad._16_8_ = 0x3f800000bf800000;
    (anonymous_namespace)::MultisampleTextureUsageCase::sampleTexture(tcu::Surface&,float)::
    fullscreenQuad._24_8_ = 0x3f80000000000000;
    (anonymous_namespace)::MultisampleTextureUsageCase::sampleTexture(tcu::Surface&,float)::
    fullscreenQuad._32_8_ = 0xbf8000003f800000;
    (anonymous_namespace)::MultisampleTextureUsageCase::sampleTexture(tcu::Surface&,float)::
    fullscreenQuad._40_8_ = 0x3f80000000000000;
    (anonymous_namespace)::MultisampleTextureUsageCase::sampleTexture(tcu::Surface&,float)::
    fullscreenQuad._48_4_ = 0x3f800000;
    (anonymous_namespace)::MultisampleTextureUsageCase::sampleTexture(tcu::Surface&,float)::
    fullscreenQuad._52_4_ = 0x3f800000;
    (anonymous_namespace)::MultisampleTextureUsageCase::sampleTexture(tcu::Surface&,float)::
    fullscreenQuad._56_4_ = 0;
    (anonymous_namespace)::MultisampleTextureUsageCase::sampleTexture(tcu::Surface&,float)::
    fullscreenQuad._60_4_ = 0x3f800000;
    __cxa_guard_release(&(anonymous_namespace)::MultisampleTextureUsageCase::
                         sampleTexture(tcu::Surface&,float)::fullscreenQuad);
  }
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var_00,iVar8);
  uVar9 = (**(code **)(lVar13 + 0x780))((this->m_samplerShader->m_program).m_program,"a_position");
  uVar10 = (**(code **)(lVar13 + 0xb48))((this->m_samplerShader->m_program).m_program,"u_sampler");
  uVar11 = (**(code **)(lVar13 + 0xb48))
                     ((this->m_samplerShader->m_program).m_program,"u_maxSamples");
  local_2b4 = (**(code **)(lVar13 + 0xb48))((this->m_samplerShader->m_program).m_program,"u_layer");
  uVar12 = (**(code **)(lVar13 + 0xb48))((this->m_samplerShader->m_program).m_program,"u_cmpValue");
  bVar6 = this->m_isArrayType;
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&vertexAttibBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  clearColor._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(clearColor + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Sampling from texture.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)clearColor,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(lVar13 + 0x40))(0x8892,vertexAttibBuffer.super_ObjectWrapper.m_object);
  (**(code **)(lVar13 + 0x150))
            (0x8892,0x40,
             (anonymous_namespace)::MultisampleTextureUsageCase::sampleTexture(tcu::Surface&,float)
             ::fullscreenQuad,0x88e4);
  dVar7 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar7,"bufferdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5cc);
  (**(code **)(lVar13 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar13 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar13 + 0x188))(0x4000);
  (**(code **)(lVar13 + 0x19f0))(uVar9,4,0x1406,0,0,0);
  (**(code **)(lVar13 + 0x610))(uVar9);
  (**(code **)(lVar13 + 0x1680))((this->m_samplerShader->m_program).m_program);
  (**(code **)(lVar13 + 0x14f0))(uVar10,0);
  (**(code **)(lVar13 + 0x14f0))(uVar11,this->m_numSamples);
  if (this->m_isArrayType == true) {
    (**(code **)(lVar13 + 0x14f0))(local_2b4,3);
  }
  (**(code **)(lVar13 + 0x14e0))(local_2cc,uVar12);
  (**(code **)(lVar13 + 0xb8))((uint)bVar6 * 2 + 0x9100,this->m_textureID);
  dVar7 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar7,"setup draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5e0);
  (**(code **)(lVar13 + 0x538))(5,0,4);
  dVar7 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar7,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5e3);
  (**(code **)(lVar13 + 0x518))(uVar9);
  (**(code **)(lVar13 + 0x1680))(0);
  dVar7 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar7,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5e9);
  (**(code **)(lVar13 + 0x648))();
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)clearColor,&result);
  glu::readPixels(context,0,0,(PixelBufferAccess *)clearColor);
  glu::ObjectWrapper::~ObjectWrapper(&vertexAttibBuffer.super_ObjectWrapper);
  clearColor._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(clearColor + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Verifying image.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)clearColor,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  bVar6 = false;
  __n = 0;
  while (iVar8 = (int)__n, iVar8 < result.m_height) {
    for (iVar15 = 0; iVar15 < result.m_width; iVar15 = iVar15 + 1) {
      uVar2 = *(uint *)((long)result.m_pixels.m_ptr + (long)(result.m_width * iVar8 + iVar15) * 4);
      pRVar14 = Context::getRenderTarget((this->super_TestCase).m_context);
      iVar5 = (pRVar14->m_pixelFormat).redBits;
      pRVar14 = Context::getRenderTarget((this->super_TestCase).m_context);
      iVar3 = (pRVar14->m_pixelFormat).greenBits;
      pRVar14 = Context::getRenderTarget((this->super_TestCase).m_context);
      if (((1 << (8U - (char)iVar5 & 0x1f) < (int)(uVar2 & 0xff)) ||
          ((int)(uVar2 >> 8 & 0xff) < (-1 << (8U - (char)iVar3 & 0x1f)) + 0xff)) ||
         (1 << (8U - (char)(pRVar14->m_pixelFormat).blueBits & 0x1f) < (int)(uVar2 >> 0x10 & 0xff)))
      {
        bVar6 = true;
      }
    }
    __n = (size_t)(iVar8 + 1);
  }
  if (!bVar6) {
    clearColor._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(clearColor + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"No invalid pixels found.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)clearColor,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    description = "Pass";
  }
  else {
    clearColor._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(clearColor + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Invalid pixels found.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)clearColor,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"Verification result",&local_2b5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"Result of rendering",&local_2b6);
    tcu::LogImageSet::LogImageSet((LogImageSet *)&vertexAttibBuffer,&local_228,&local_248);
    iVar8 = (int)pTVar4;
    tcu::LogImageSet::write((LogImageSet *)&vertexAttibBuffer,iVar8,__buf,__n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"Result",&local_2b7);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"Result",&local_2b8);
    surface = &result;
    tcu::LogImage::LogImage
              ((LogImage *)clearColor,&local_1e8,&local_208,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)clearColor,iVar8,__buf_00,(size_t)surface);
    tcu::TestLog::endImageSet(pTVar4);
    tcu::LogImage::~LogImage((LogImage *)clearColor);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&vertexAttibBuffer);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
    description = "Image verification failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar6,description)
  ;
  tcu::Surface::~Surface(&result);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return STOP;
}

Assistant:

MultisampleTextureUsageCase::IterateResult MultisampleTextureUsageCase::iterate (void)
{
	const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Sample", "Render to texture and sample texture");
	tcu::Surface				result			(s_textureSize, s_textureSize);
	const float					minValue		= (m_isColorFormat || m_isDepthFormat) ? (0.0f) : (m_isSignedFormat) ? (-100.0f) : (m_isUnsignedFormat) ? (0.0f)	: ( 1.0f);
	const float					maxValue		= (m_isColorFormat || m_isDepthFormat) ? (1.0f) : (m_isSignedFormat) ? ( 100.0f) : (m_isUnsignedFormat) ? (200.0f)	: (-1.0f);
	de::Random					rnd				(deUint32Hash((deUint32)m_type));
	const float					rawValue		= rnd.getFloat(minValue, maxValue);
	const float					preparedValue	= (m_isSignedFormat || m_isUnsignedFormat) ? (deFloatFloor(rawValue)) : (rawValue);

	// draw to fbo with a random value

	renderToTexture(preparedValue);

	// draw from texture to front buffer

	sampleTexture(result, preparedValue);

	// result is ok?

	if (verifyImage(result))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

	return STOP;
}